

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O1

void phmap::priv::
     common_params<phmap::test_internal::CopyableMovableInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false,_phmap::priv::map_slot_policy<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>
     ::transfer(allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  (new_slot->value).first.super_BaseCountedInstance.value_ =
       (old_slot->value).first.super_BaseCountedInstance.value_;
  (new_slot->value).first.super_BaseCountedInstance.is_live_ =
       (old_slot->value).first.super_BaseCountedInstance.is_live_;
  (old_slot->value).first.super_BaseCountedInstance.is_live_ = false;
  (new_slot->value).second.super_BaseCountedInstance.value_ =
       (old_slot->value).second.super_BaseCountedInstance.value_;
  (new_slot->value).second.super_BaseCountedInstance.is_live_ =
       (old_slot->value).second.super_BaseCountedInstance.is_live_;
  (old_slot->value).second.super_BaseCountedInstance.is_live_ = false;
  test_internal::BaseCountedInstance::num_moves_ =
       test_internal::BaseCountedInstance::num_moves_ + 2;
  if ((old_slot->value).first.super_BaseCountedInstance.is_live_ == true) {
    test_internal::BaseCountedInstance::num_live_instances_ =
         test_internal::BaseCountedInstance::num_live_instances_ + -1;
  }
  return;
}

Assistant:

BaseCountedInstance(BaseCountedInstance&& x)
            : value_(x.value_), is_live_(x.is_live_) {
            x.is_live_ = false;
            ++num_instances_;
            ++num_moves_;
        }